

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000220200 = 0x2e2e2e2e2e2e2e;
    uRam0000000000220207 = 0x2e2e2e2e2e2e2e2e;
    _DAT_002201f0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000002201f8 = 0x2e2e2e2e2e2e2e;
    DAT_002201ff = 0x2e;
    _DAT_002201e0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000002201e8 = 0x2e2e2e2e2e2e2e2e;
    _DAT_002201d0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000002201d8 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam00000000002201c8 = 0x2e2e2e2e2e2e2e2e;
    DAT_0022020f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}